

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditPrivate::completionHighlighted(QLineEditPrivate *this,QString *newText)

{
  int pos;
  QLineEdit *this_00;
  char16_t *pcVar1;
  CompletionMode CVar2;
  CutResult CVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  long in_FS_OFFSET;
  QStringBuilder<QStringView,_QStringView> local_90;
  QString local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEdit **)&(this->super_QWidgetPrivate).field_0x8;
  CVar2 = QCompleter::completionMode((QCompleter *)(this->control->m_completer).wp.value);
  if (CVar2 == InlineCompletion) {
    pos = this->control->m_cursor;
    puVar5 = (undefined1 *)(long)pos;
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetLineControl::text(&local_58,(QWidgetLineControl *)this->control);
    local_90.a.m_data = local_58.d.ptr;
    puVar4 = (undefined1 *)local_58.d.size;
    if (puVar5 <= (ulong)local_58.d.size) {
      puVar4 = puVar5;
    }
    pcVar1 = (newText->d).ptr;
    local_70.d.d = (Data *)0xffffffffffffffff;
    local_90.a.m_size = (qsizetype)puVar5;
    CVar3 = QtPrivate::QContainerImplHelper::mid
                      ((newText->d).size,(qsizetype *)&local_90,(qsizetype *)&local_70);
    if (CVar3 == Null) {
      local_90.b.m_size = 0;
      local_90.b.m_data = (char16_t *)0x0;
    }
    else {
      local_90.b.m_data = pcVar1 + local_90.a.m_size;
      local_90.b.m_size = (qsizetype)local_70.d.d;
    }
    local_90.a.m_size = (qsizetype)puVar4;
    QStringBuilder<QStringView,_QStringView>::convertTo<QString>(&local_70,&local_90);
    QLineEdit::setText(this_00,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    QWidgetLineControl::moveCursor
              ((QWidgetLineControl *)this->control,(int)(this->control->m_text).d.size,false);
    QWidgetLineControl::moveCursor((QWidgetLineControl *)this->control,pos,true);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QLineEdit::setText(this_00,newText);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::completionHighlighted(const QString &newText)
{
    Q_Q(QLineEdit);
    if (control->completer()->completionMode() != QCompleter::InlineCompletion) {
        q->setText(newText);
    } else {
        int c = control->cursor();
        QString text = control->text();
        q->setText(QStringView{text}.left(c) + QStringView{newText}.mid(c));
        control->moveCursor(control->end(), false);
#ifndef Q_OS_ANDROID
        const bool mark = true;
#else
        const bool mark = (imHints & Qt::ImhNoPredictiveText);
#endif
        control->moveCursor(c, mark);
    }
}